

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O0

bool __thiscall duckdb::uhugeint_t::operator_bool(uhugeint_t *this)

{
  bool bVar1;
  uhugeint_t *in_RDI;
  uhugeint_t *unaff_retaddr;
  uhugeint_t local_18;
  
  uhugeint_t(&local_18,0);
  bVar1 = operator!=(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

uhugeint_t::operator bool() const {
	return *this != 0;
}